

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode Curl_update_timer(Curl_multi *multi)

{
  Curl_tree *pCVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  byte bVar5;
  void *pvVar6;
  CURLMcode CVar7;
  long timeout_ms;
  long local_20;
  
  CVar7 = CURLM_OK;
  if ((multi->timer_cb != (curl_multi_timer_callback)0x0) &&
     (CVar7 = CURLM_OK, (multi->field_0x1b1 & 0x10) == 0)) {
    multi_timeout(multi,&local_20);
    if (local_20 < 0) {
      if (((multi->timer_lastcall).tv_sec == 0) && ((multi->timer_lastcall).tv_usec == 0)) {
        return CURLM_OK;
      }
      (multi->timer_lastcall).tv_sec = 0;
      *(undefined8 *)&(multi->timer_lastcall).tv_usec = 0;
      multi->field_0x1b1 = multi->field_0x1b1 | 4;
      pvVar6 = multi->timer_userp;
      local_20 = -1;
    }
    else {
      pCVar1 = multi->timetree;
      if (((pCVar1->key).tv_sec == (multi->timer_lastcall).tv_sec) &&
         ((pCVar1->key).tv_usec == (multi->timer_lastcall).tv_usec)) {
        return CURLM_OK;
      }
      uVar2 = *(undefined4 *)((long)&(pCVar1->key).tv_sec + 4);
      iVar4 = (pCVar1->key).tv_usec;
      uVar3 = *(undefined4 *)&(pCVar1->key).field_0xc;
      *(int *)&(multi->timer_lastcall).tv_sec = (int)(pCVar1->key).tv_sec;
      *(undefined4 *)((long)&(multi->timer_lastcall).tv_sec + 4) = uVar2;
      (multi->timer_lastcall).tv_usec = iVar4;
      *(undefined4 *)&(multi->timer_lastcall).field_0xc = uVar3;
      multi->field_0x1b1 = multi->field_0x1b1 | 4;
      pvVar6 = multi->timer_userp;
    }
    iVar4 = (*multi->timer_cb)(multi,local_20,pvVar6);
    bVar5 = multi->field_0x1b1 & 0xfb;
    multi->field_0x1b1 = bVar5;
    if (iVar4 == -1) {
      multi->field_0x1b1 = bVar5 | 0x10;
      CVar7 = CURLM_ABORTED_BY_CALLBACK;
    }
  }
  return CVar7;
}

Assistant:

CURLMcode Curl_update_timer(struct Curl_multi *multi)
{
  long timeout_ms;
  int rc;

  if(!multi->timer_cb || multi->dead)
    return CURLM_OK;
  if(multi_timeout(multi, &timeout_ms)) {
    return CURLM_OK;
  }
  if(timeout_ms < 0) {
    static const struct curltime none = {0, 0};
    if(Curl_splaycomparekeys(none, multi->timer_lastcall)) {
      multi->timer_lastcall = none;
      /* there's no timeout now but there was one previously, tell the app to
         disable it */
      set_in_callback(multi, TRUE);
      rc = multi->timer_cb(multi, -1, multi->timer_userp);
      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
      return CURLM_OK;
    }
    return CURLM_OK;
  }

  /* When multi_timeout() is done, multi->timetree points to the node with the
   * timeout we got the (relative) time-out time for. We can thus easily check
   * if this is the same (fixed) time as we got in a previous call and then
   * avoid calling the callback again. */
  if(Curl_splaycomparekeys(multi->timetree->key, multi->timer_lastcall) == 0)
    return CURLM_OK;

  multi->timer_lastcall = multi->timetree->key;

  set_in_callback(multi, TRUE);
  rc = multi->timer_cb(multi, timeout_ms, multi->timer_userp);
  set_in_callback(multi, FALSE);
  if(rc == -1) {
    multi->dead = TRUE;
    return CURLM_ABORTED_BY_CALLBACK;
  }
  return CURLM_OK;
}